

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcStairFlight::IfcStairFlight(IfcStairFlight *this)

{
  *(undefined ***)&this->field_0x198 = &PTR__Object_008048a0;
  *(undefined8 *)&this->field_0x1a0 = 0;
  *(char **)&this->field_0x1a8 = "IfcStairFlight";
  IfcBuildingElement::IfcBuildingElement
            ((IfcBuildingElement *)this,&PTR_construction_vtable_24__008aa9f8);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x8aa8c8;
  *(undefined8 *)&this->field_0x198 = 0x8aa9e0;
  *(undefined8 *)&this->field_0x88 = 0x8aa8f0;
  *(undefined8 *)&this->field_0x98 = 0x8aa918;
  *(undefined8 *)&this->field_0xd0 = 0x8aa940;
  *(undefined8 *)&this->field_0x100 = 0x8aa968;
  *(undefined8 *)&this->field_0x138 = 0x8aa990;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>)._vptr_ObjectHelper =
       (_func_int **)0x8aa9b8;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcStairFlight,_4UL>).field_0x18 = 0;
  this->field_0x170 = 0;
  (this->RiserHeight).have = false;
  (this->TreadLength).have = false;
  return;
}

Assistant:

IfcStairFlight() : Object("IfcStairFlight") {}